

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadCord(CodedInputStream *this,Cord *output,int size)

{
  undefined1 uVar1;
  bool bVar2;
  string *psVar3;
  CodedInputStream *this_00;
  int iVar4;
  int iVar5;
  undefined2 *buffer;
  undefined2 uStack_5a;
  Cord *pCStack_58;
  CodedInputStream *pCStack_50;
  CodedInputStream local_40 [16];
  
  if (output == (Cord *)0x0) {
    pCStack_50 = (CodedInputStream *)0x1682a5;
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       ((void *)0x0,(void *)0x0,"output != nullptr");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 != (string *)0x0) {
    this_00 = local_40;
    pCStack_50 = (CodedInputStream *)0x1682cd;
    ReadCord();
    pCStack_50 = this;
    pCStack_58 = output;
    buffer = *(undefined2 **)this_00;
    if (*(int *)(this_00 + 8) - (int)buffer < 2) {
      buffer = &uStack_5a;
      bVar2 = ReadRaw(this_00,buffer,2);
      if (!bVar2) {
        return false;
      }
    }
    else {
      *(undefined2 **)this_00 = buffer + 1;
    }
    *(undefined2 *)psVar3 = *buffer;
    return true;
  }
  if (size < 0) {
    pCStack_50 = (CodedInputStream *)0x16823c;
    absl::lts_20240722::Cord::Clear();
  }
  else {
    if ((size < 0x200) || (*(long *)(this + 0x10) == 0)) {
      iVar5 = *(int *)(this + 8) - (int)*(undefined8 *)this;
      iVar4 = size;
      if (iVar5 < size) {
        iVar4 = iVar5;
      }
      pCStack_50 = (CodedInputStream *)0x168262;
      absl::lts_20240722::Cord::operator=(output,(long)iVar4);
      *(long *)this = *(long *)this + (long)iVar4;
      bVar2 = size <= iVar5;
      if (size <= iVar5) {
        return bVar2;
      }
      if (*(long *)(this + 0x10) == 0) {
        return bVar2;
      }
      iVar5 = *(int *)(this + 0x1c) + *(int *)(this + 0x2c);
      if (iVar5 != 0 && SCARRY4(*(int *)(this + 0x1c),*(int *)(this + 0x2c)) == iVar5 < 0) {
        return bVar2;
      }
      size = size - iVar4;
    }
    else {
      pCStack_50 = (CodedInputStream *)0x1681e9;
      absl::lts_20240722::Cord::Clear();
      pCStack_50 = (CodedInputStream *)0x1681f1;
      BackUpInputToCurrentPosition(this);
    }
    iVar4 = *(int *)(this + 0x28);
    if (*(int *)(this + 0x30) < *(int *)(this + 0x28)) {
      iVar4 = *(int *)(this + 0x30);
    }
    if (size <= iVar4 - *(int *)(this + 0x18)) {
      *(int *)(this + 0x18) = *(int *)(this + 0x18) + size;
      uVar1 = (**(code **)(**(long **)(this + 0x10) + 0x30))(*(long **)(this + 0x10),output,size);
      return (bool)uVar1;
    }
    *(int *)(this + 0x18) = iVar4;
    pCStack_50 = (CodedInputStream *)0x1682bb;
    (**(code **)(**(long **)(this + 0x10) + 0x30))(*(long **)(this + 0x10),output);
  }
  return false;
}

Assistant:

bool CodedInputStream::ReadCord(absl::Cord* output, int size) {
  ABSL_DCHECK_NE(output, nullptr);

  // security: size is often user-supplied
  if (size < 0) {
    output->Clear();
    return false;  // security: size is often user-supplied
  }

  // Grab whatever is in the current output if `size` is relatively small,
  // or if we are not sourcing data from an input stream.
  if (input_ == nullptr || size < kMaxCordBytesToCopy) {
    // Just copy the current buffer into the output rather than backing up.
    absl::string_view buffer(reinterpret_cast<const char*>(buffer_),
                             static_cast<size_t>(std::min(size, BufferSize())));
    *output = buffer;
    Advance(static_cast<int>(buffer.size()));
    size -= static_cast<int>(buffer.size());
    if (size == 0) return true;
    if (input_ == nullptr || buffer_size_after_limit_ + overflow_bytes_ > 0) {
      // We hit a limit.
      return false;
    }
  } else {
    output->Clear();
    BackUpInputToCurrentPosition();
  }

  // Make sure to not cross a limit set by PushLimit() or SetTotalBytesLimit().
  const int closest_limit = std::min(current_limit_, total_bytes_limit_);
  const int available = closest_limit - total_bytes_read_;
  if (PROTOBUF_PREDICT_FALSE(size > available)) {
    total_bytes_read_ = closest_limit;
    input_->ReadCord(output, available);
    return false;
  }
  total_bytes_read_ += size;
  return input_->ReadCord(output, size);
}